

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

OneofOptions *
google::protobuf::Arena::CreateMessageInternal<google::protobuf::OneofOptions>(Arena *arena)

{
  OneofOptions *this;
  
  if (arena == (Arena *)0x0) {
    this = (OneofOptions *)operator_new(0x48);
    OneofOptions::OneofOptions(this,(Arena *)0x0,false);
  }
  else {
    this = (OneofOptions *)AllocateAlignedWithHook(arena,0x48,(type_info *)&OneofOptions::typeinfo);
    OneofOptions::OneofOptions(this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }